

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::clearFilters(Context *this)

{
  size_type sVar1;
  reference this_00;
  uint local_14;
  uint i;
  Context *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
            ::size(&this->p->filters);
    if (sVar1 <= local_14) break;
    this_00 = std::
              vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
              ::operator[](&this->p->filters,(ulong)local_14);
    std::vector<doctest::String,_std::allocator<doctest::String>_>::clear(this_00);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(unsigned i = 0; i < p->filters.size(); ++i)
        p->filters[i].clear();
}